

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZHelp.cpp
# Opt level: O0

void CZHelp::rtrim(string *s)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  undefined8 local_40;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  char *local_18;
  undefined8 local_10;
  
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,CZHelp::rtrim(std::__cxx11::string&)::__0>
            (&local_20,local_28,local_30);
  local_18 = (char *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::base(&local_20);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffb0,in_RDI);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffb0,in_RDI);
  std::__cxx11::string::erase(in_RDI,local_10,local_40);
  return;
}

Assistant:

void CZHelp::rtrim(std::string &s) {
    s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
        return !std::isspace(ch);
    }).base(), s.end());
}